

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O0

void __thiscall
r_exec::CSTController::inject_icst
          (CSTController *this,Fact *production,double confidence,uint64_t time_to_live)

{
  uint16_t uVar1;
  uint32_t uVar2;
  ulong ijt;
  Group *this_00;
  View *pVVar3;
  long lVar4;
  int64_t iVar5;
  _Mem *p_Var6;
  Code *destination;
  float fVar7;
  View *view_2;
  View *view_1;
  Group *out_group;
  uint16_t i;
  uint16_t out_group_count;
  View *view;
  float sln_thr;
  Group *primary_host;
  uint64_t now;
  uint64_t time_to_live_local;
  double confidence_local;
  Fact *production_local;
  CSTController *this_local;
  
  ijt = (*Now)();
  this_00 = HLPController::get_host(&this->super_HLPController);
  (*(this_00->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code
    .super__Object._vptr__Object[4])(this_00,2);
  fVar7 = (float)r_code::Atom::asFloat();
  if ((double)fVar7 < confidence) {
    pVVar3 = (View *)operator_new(0x100);
    uVar2 = Group::get_upr(this_00);
    lVar4 = r_code::Utils::GetBasePeriod();
    iVar5 = r_code::Utils::GetResilience(ijt,time_to_live,(ulong)uVar2 * lVar4);
    View::View(pVVar3,SYNC_ONCE,ijt,1.0,iVar5,(Code *)this_00,(Code *)this_00,(Code *)production);
    p_Var6 = _Mem::Get();
    _Mem::inject(p_Var6,pVVar3);
    uVar1 = HLPController::get_out_group_count(&this->super_HLPController);
    for (out_group._0_2_ = 0; (ushort)out_group < uVar1; out_group._0_2_ = (ushort)out_group + 1) {
      destination = HLPController::get_out_group(&this->super_HLPController,(ushort)out_group);
      pVVar3 = (View *)operator_new(0x100);
      View::View(pVVar3,SYNC_ONCE,ijt,1.0,1,destination,(Code *)this_00,(Code *)production);
      p_Var6 = _Mem::Get();
      _Mem::inject(p_Var6,pVVar3);
    }
  }
  (*(this->secondary_host->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
    super_LObject.super_Code.super__Object._vptr__Object[4])(this->secondary_host,2);
  fVar7 = (float)r_code::Atom::asFloat();
  if ((double)fVar7 < confidence) {
    pVVar3 = (View *)operator_new(0x100);
    uVar2 = Group::get_upr(this->secondary_host);
    lVar4 = r_code::Utils::GetBasePeriod();
    iVar5 = r_code::Utils::GetResilience(ijt,time_to_live,(ulong)uVar2 * lVar4);
    View::View(pVVar3,SYNC_ONCE,ijt,1.0,iVar5,(Code *)this->secondary_host,(Code *)this_00,
               (Code *)production);
    p_Var6 = _Mem::Get();
    _Mem::inject(p_Var6,pVVar3);
  }
  return;
}

Assistant:

void CSTController::inject_icst(Fact *production, double confidence, uint64_t time_to_live) const   // production: f->icst.
{
    uint64_t now = Now();
    Group *primary_host = get_host();
    float sln_thr = primary_host->code(GRP_SLN_THR).asFloat();

    if (confidence > sln_thr) {
        View *view = new View(View::SYNC_ONCE, now, 1, Utils::GetResilience(now, time_to_live, primary_host->get_upr()*Utils::GetBasePeriod()), primary_host, primary_host, production);
        _Mem::Get()->inject(view); // inject f->icst in the primary group: needed for hlps like M[icst -> X] and S[icst X Y].
        uint16_t out_group_count = get_out_group_count();

        for (uint16_t i = 0; i < out_group_count; ++i) {
            Group *out_group = (Group *)get_out_group(i);
            View *view = new View(View::SYNC_ONCE, now, 1, 1, out_group, primary_host, production);
            _Mem::Get()->inject(view);
        }
    }

    sln_thr = secondary_host->code(GRP_SLN_THR).asFloat();

    if (confidence > sln_thr) {
        View *view = new View(View::SYNC_ONCE, now, 1, Utils::GetResilience(now, time_to_live, secondary_host->get_upr()*Utils::GetBasePeriod()), secondary_host, primary_host, production);
        _Mem::Get()->inject(view); // inject f->icst in the secondary group: same reason as above.
    }
}